

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O0

error_code __thiscall
websocketpp::connection<websocketpp::config::asio>::send_close_frame
          (connection<websocketpp::config::asio> *this,value code,string *reason,bool ack,
          bool terminal)

{
  ushort uVar1;
  bool bVar2;
  element_type *peVar3;
  ostream *poVar4;
  connection<websocketpp::config::asio> *this_00;
  element_type *this_01;
  ulong in_RCX;
  size_t __n;
  string *in_RDX;
  error_category *extraout_RDX;
  short in_SI;
  dispatch_handler *in_RDI;
  byte in_R8B;
  error_code eVar5;
  scoped_lock_type lock;
  bool needs_writing;
  error_code ec;
  message_ptr msg;
  stringstream s;
  _Placeholder<1> *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc60;
  uint in_stack_fffffffffffffc64;
  _Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
  *in_stack_fffffffffffffc68;
  _Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>))()>
  *__f;
  function<void_(const_std::error_code_&)> *in_stack_fffffffffffffc70;
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  *in_stack_fffffffffffffc88;
  _Invoker_type *pp_Var6;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  _Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>))()>
  local_2b0;
  timer_handler *in_stack_fffffffffffffd78;
  code *duration;
  connection<websocketpp::config::asio::transport_config> *this_02;
  undefined1 local_220 [16];
  error_code local_210;
  undefined4 local_1fc;
  __shared_ptr local_1f8 [16];
  string local_1e8 [48];
  message_ptr *in_stack_fffffffffffffe48;
  connection<websocketpp::config::asio> *in_stack_fffffffffffffe50;
  ostream local_1a8 [382];
  byte local_2a;
  byte local_29;
  string *local_28;
  short local_1a;
  ulong local_10;
  error_category *local_8;
  
  __n = in_RCX & 0xffffffffffffff01;
  local_29 = (byte)__n;
  local_2a = in_R8B & 1;
  local_28 = in_RDX;
  local_1a = in_SI;
  peVar3 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ec021);
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (peVar3,0x400,"send_close_frame",__n);
  if (local_1a == 0) {
    if ((local_29 & 1) == 0) {
      peVar3 = std::
               __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ec0b8);
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (peVar3,0x400,"closing with no status code",__n);
      *(undefined2 *)&in_RDI[0x276].super__Function_base._M_manager = 0x3ed;
      std::__cxx11::string::clear();
    }
    else if (*(short *)&in_RDI[0x277]._M_invoker == 0x3ed) {
      peVar3 = std::
               __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ec118);
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (peVar3,0x400,"acknowledging a no-status close with normal code",__n);
      *(undefined2 *)&in_RDI[0x276].super__Function_base._M_manager = 1000;
      std::__cxx11::string::clear();
    }
    else {
      peVar3 = std::
               __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ec15f);
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (peVar3,0x400,"acknowledging with remote codes",__n);
      *(undefined2 *)&in_RDI[0x276].super__Function_base._M_manager =
           *(undefined2 *)&in_RDI[0x277]._M_invoker;
      std::__cxx11::string::operator=
                ((string *)&in_RDI[0x276]._M_invoker,(string *)(in_RDI + 0x278));
    }
  }
  else {
    peVar3 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ec056);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar3,0x400,"closing with specified codes",__n);
    *(short *)&in_RDI[0x276].super__Function_base._M_manager = local_1a;
    std::__cxx11::string::operator=((string *)&in_RDI[0x276]._M_invoker,local_28);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe48);
  poVar4 = std::operator<<(local_1a8,"Closing with code: ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,*(ushort *)&in_RDI[0x276].super__Function_base._M_manager);
  poVar4 = std::operator<<(poVar4,", and reason: ");
  std::operator<<(poVar4,(string *)&in_RDI[0x276]._M_invoker);
  peVar3 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ec232);
  std::__cxx11::stringstream::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (peVar3,0x400,local_1e8,__n);
  std::__cxx11::string::~string(local_1e8);
  std::
  __shared_ptr_access<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2ec288);
  message_buffer::alloc::
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  ::get_message(in_stack_fffffffffffffc88);
  bVar2 = std::__shared_ptr::operator_cast_to_bool(local_1f8);
  if (bVar2) {
    this_00 = (connection<websocketpp::config::asio> *)
              std::
              __shared_ptr_access<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2ec358);
    uVar1 = *(ushort *)&in_RDI[0x276].super__Function_base._M_manager;
    pp_Var6 = &in_RDI[0x276]._M_invoker;
    std::
    shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
    ::shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                  *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                  *)in_stack_fffffffffffffc58);
    local_210._M_value =
         (**(_func_int **)
            &(this_00->super_transport_con_type).super_socket_con_type.
             super_enable_shared_from_this<websocketpp::transport::asio::basic_socket::connection>.
             _M_weak_this.
             super___weak_ptr<websocketpp::transport::asio::basic_socket::connection,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr[2].
             super_enable_shared_from_this<websocketpp::transport::asio::basic_socket::connection>)
                   (this_00,(ulong)uVar1,pp_Var6,local_220);
    local_210._M_cat = extraout_RDX;
    std::
    shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
    ::~shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                   *)0x2ec3e7);
    bVar2 = std::error_code::operator_cast_to_bool(&local_210);
    if (bVar2) {
      local_10 = CONCAT44(local_210._4_4_,local_210._M_value);
      local_8 = local_210._M_cat;
    }
    else {
      if ((local_2a & 1) != 0) {
        this_01 = std::
                  __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2ec467);
        message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::set_terminal
                  (this_01,true);
      }
      *(undefined4 *)&in_RDI[0x59].super__Function_base._M_manager = 2;
      if ((local_29 & 1) != 0) {
        *(undefined1 *)&in_RDI[0x279]._M_invoker = 1;
      }
      if (0 < (long)in_RDI[0x58]._M_invoker) {
        in_stack_fffffffffffffc70 =
             (function<void_(const_std::error_code_&)> *)in_RDI[0x58]._M_invoker;
        duration = handle_close_handshake_timeout;
        this_02 = (connection<websocketpp::config::asio::transport_config> *)0x0;
        get_shared(this_00);
        std::
        bind<void(websocketpp::connection<websocketpp::config::asio>::*)(std::error_code_const&),std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>const&>
                  (&in_stack_fffffffffffffc68->_M_f,
                   (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   in_stack_fffffffffffffc58);
        std::function<void(std::error_code_const&)>::
        function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>))(std::error_code_const&)>,void>
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        transport::asio::connection<websocketpp::config::asio::transport_config>::set_timer
                  (this_02,(long)duration,in_stack_fffffffffffffd78);
        std::
        shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::operator=((shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                     *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                     *)in_stack_fffffffffffffc58);
        std::
        shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::~shared_ptr((shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                       *)0x2ec581);
        std::function<void_(const_std::error_code_&)>::~function
                  ((function<void_(const_std::error_code_&)> *)0x2ec58e);
        std::
        _Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
        ::~_Bind((_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
                  *)0x2ec59b);
        std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::~shared_ptr
                  ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x2ec5a8);
      }
      local_2b0._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>_>.
      super__Head_base<0UL,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_false>
      ._M_head_impl.
      super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._7_1_ = 0;
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)
                 CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (mutex_type *)in_stack_fffffffffffffc58);
      __f = &local_2b0;
      std::
      shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
      ::shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                    *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                    *)in_stack_fffffffffffffc58);
      write_push(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::
      shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
      ::~shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                     *)0x2ec677);
      in_stack_fffffffffffffc64 = in_stack_fffffffffffffc64 & 0xffffff;
      if (((ulong)in_RDI[0x264]._M_invoker & 1) == 0) {
        bVar2 = std::
                queue<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::deque<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>_>
                ::empty((queue<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::deque<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>_>
                         *)0x2ec6a2);
        in_stack_fffffffffffffc64 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc64) ^ 0xff000000;
      }
      local_2b0._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>_>.
      super__Head_base<0UL,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_false>
      ._M_head_impl.
      super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._7_1_ = (byte)(in_stack_fffffffffffffc64 >> 0x18) & 1;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2ec6c2);
      if ((local_2b0._M_bound_args.
           super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>_>
           .
           super__Head_base<0UL,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_false>
           ._M_head_impl.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._7_1_ & 1) != 0) {
        get_shared(this_00);
        std::
        bind<void(websocketpp::connection<websocketpp::config::asio>::*)(),std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>>
                  (&__f->_M_f,
                   (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
        std::function<void()>::
        function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>))()>,void>
                  ((function<void_()> *)in_stack_fffffffffffffc70,__f);
        eVar5 = transport::asio::connection<websocketpp::config::asio::transport_config>::dispatch
                          ((connection<websocketpp::config::asio::transport_config> *)
                           CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),in_RDI);
        in_stack_fffffffffffffc60 = eVar5._M_value;
        std::function<void_()>::~function((function<void_()> *)0x2ec77b);
        std::
        _Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>))()>
        ::~_Bind((_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>))()>
                  *)0x2ec788);
        std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::~shared_ptr
                  ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x2ec795);
      }
      std::error_code::error_code
                ((error_code *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    }
  }
  else {
    eVar5 = error::make_error_code(0);
    local_8 = eVar5._M_cat;
    local_10 = CONCAT44(local_10._4_4_,eVar5._M_value);
  }
  local_1fc = 1;
  std::
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  ::~shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                 *)0x2ec85b);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe48);
  eVar5._0_8_ = local_10 & 0xffffffff;
  eVar5._M_cat = local_8;
  return eVar5;
}

Assistant:

lib::error_code connection<config>::send_close_frame(close::status::value code,
    std::string const & reason, bool ack, bool terminal)
{
    m_alog->write(log::alevel::devel,"send_close_frame");

    // check for special codes

    // If silent close is set, respect it and blank out close information
    // Otherwise use whatever has been specified in the parameters. If
    // parameters specifies close::status::blank then determine what to do
    // based on whether or not this is an ack. If it is not an ack just
    // send blank info. If it is an ack then echo the close information from
    // the remote endpoint.
    if (config::silent_close) {
        m_alog->write(log::alevel::devel,"closing silently");
        m_local_close_code = close::status::no_status;
        m_local_close_reason.clear();
    } else if (code != close::status::blank) {
        m_alog->write(log::alevel::devel,"closing with specified codes");
        m_local_close_code = code;
        m_local_close_reason = reason;
    } else if (!ack) {
        m_alog->write(log::alevel::devel,"closing with no status code");
        m_local_close_code = close::status::no_status;
        m_local_close_reason.clear();
    } else if (m_remote_close_code == close::status::no_status) {
        m_alog->write(log::alevel::devel,
            "acknowledging a no-status close with normal code");
        m_local_close_code = close::status::normal;
        m_local_close_reason.clear();
    } else {
        m_alog->write(log::alevel::devel,"acknowledging with remote codes");
        m_local_close_code = m_remote_close_code;
        m_local_close_reason = m_remote_close_reason;
    }

    std::stringstream s;
    s << "Closing with code: " << m_local_close_code << ", and reason: "
      << m_local_close_reason;
    m_alog->write(log::alevel::devel,s.str());

    message_ptr msg = m_msg_manager->get_message();
    if (!msg) {
        return error::make_error_code(error::no_outgoing_buffers);
    }

    lib::error_code ec = m_processor->prepare_close(m_local_close_code,
        m_local_close_reason,msg);
    if (ec) {
        return ec;
    }

    // Messages flagged terminal will result in the TCP connection being dropped
    // after the message has been written. This is typically used when servers
    // send an ack and when any endpoint encounters a protocol error
    if (terminal) {
        msg->set_terminal(true);
    }

    m_state = session::state::closing;

    if (ack) {
        m_was_clean = true;
    }

    // Start a timer so we don't wait forever for the acknowledgement close
    // frame
    if (m_close_handshake_timeout_dur > 0) {
        m_handshake_timer = transport_con_type::set_timer(
            m_close_handshake_timeout_dur,
            lib::bind(
                &type::handle_close_handshake_timeout,
                type::get_shared(),
                lib::placeholders::_1
            )
        );
    }

    bool needs_writing = false;
    {
        scoped_lock_type lock(m_write_lock);
        write_push(msg);
        needs_writing = !m_write_flag && !m_send_queue.empty();
    }

    if (needs_writing) {
        transport_con_type::dispatch(lib::bind(
            &type::write_frame,
            type::get_shared()
        ));
    }

    return lib::error_code();
}